

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintInt32
          (FastFieldValuePrinter *this,int32_t val,BaseTextGenerator *generator)

{
  AlphaNum *a;
  AlphaNum local_70;
  string local_40;
  BaseTextGenerator *local_20;
  BaseTextGenerator *generator_local;
  FastFieldValuePrinter *pFStack_10;
  int32_t val_local;
  FastFieldValuePrinter *this_local;
  
  local_20 = generator;
  generator_local._4_4_ = val;
  pFStack_10 = this;
  strings::AlphaNum::AlphaNum(&local_70,val);
  StrCat_abi_cxx11_(&local_40,(protobuf *)&local_70,a);
  BaseTextGenerator::PrintString(generator,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintInt32(
    int32_t val, BaseTextGenerator* generator) const {
  generator->PrintString(StrCat(val));
}